

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_24::BinaryReader::ReadModule(BinaryReader *this)

{
  bool bVar1;
  Result RVar2;
  uint32_t local_24;
  Enum local_20;
  uint32_t version;
  BinaryReader *pBStack_18;
  uint32_t magic;
  BinaryReader *this_local;
  
  version = 0;
  pBStack_18 = this;
  local_20 = (Enum)ReadU32(this,&version,"magic");
  bVar1 = Failed((Result)local_20);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (version == 0x6d736100) {
    local_24 = 0;
    RVar2 = ReadU32(this,&local_24,"version");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else if (local_24 == 1) {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[4])();
      bVar1 = Succeeded(RVar2);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        RVar2 = ReadSections(this);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else if (this->num_function_signatures_ == this->num_function_bodies_) {
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[5])();
          bVar1 = Succeeded(RVar2);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
          else {
            PrintError(this,"EndModule callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"function signature count != function body count");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"BeginModule callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      PrintError(this,"bad wasm file version: %#x (expected %#x)",(ulong)local_24,1);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    PrintError(this,"bad magic value");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadModule() {
  uint32_t magic = 0;
  CHECK_RESULT(ReadU32(&magic, "magic"));
  ERROR_UNLESS(magic == WABT_BINARY_MAGIC, "bad magic value");
  uint32_t version = 0;
  CHECK_RESULT(ReadU32(&version, "version"));
  ERROR_UNLESS(version == WABT_BINARY_VERSION,
               "bad wasm file version: %#x (expected %#x)", version,
               WABT_BINARY_VERSION);

  CALLBACK(BeginModule, version);
  CHECK_RESULT(ReadSections());
  // This is checked in ReadCodeSection, but it must be checked at the end too,
  // in case the code section was omitted.
  ERROR_UNLESS(num_function_signatures_ == num_function_bodies_,
               "function signature count != function body count");
  CALLBACK0(EndModule);

  return Result::Ok;
}